

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_CountNonExist_Test::TestBody(TApp_CountNonExist_Test *this)

{
  App *this_00;
  bool bVar1;
  AssertHelper AStack_98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90 [4];
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"-c,--count",(allocator *)local_90);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&AStack_98);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_flag(this_00,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)local_90,"-c",(allocator *)&AStack_98);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_90,&local_70);
  std::__cxx11::string::~string((string *)local_90);
  TApp::run(&this->super_TApp);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,"--nonexist",(allocator *)local_90);
    CLI::App::count(this_00,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  testing::Message::Message((Message *)local_90);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x10,
             "Expected: app.count(\"--nonexist\") throws an exception of type CLI::OptionNotFound.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_98,(Message *)local_90);
  testing::internal::AssertHelper::~AssertHelper(&AStack_98);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_90);
  return;
}

Assistant:

TEST_F(TApp, CountNonExist) {
    app.add_flag("-c,--count");
    args = {"-c"};
    run();
    EXPECT_THROW(app.count("--nonexist"), CLI::OptionNotFound);
}